

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng_util.cpp
# Opt level: O1

uint lodepng::getFilterTypesInterlaced
               (vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                *filterTypes,vector<unsigned_char,_std::allocator<unsigned_char>_> *png)

{
  pointer *ppuVar1;
  iterator iVar2;
  vector<unsigned_char,std::allocator<unsigned_char>> *pvVar3;
  bool bVar4;
  pointer puVar5;
  uint uVar6;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *pvVar7;
  uint uVar8;
  int iVar9;
  uint w_00;
  size_t sVar10;
  uchar *puVar11;
  size_t sVar12;
  char cVar13;
  uint uVar14;
  size_t j;
  uchar *puVar15;
  long lVar16;
  ulong uVar17;
  long lVar18;
  uint w;
  char type [5];
  vector<unsigned_char,_std::allocator<unsigned_char>_> data;
  uint h;
  vector<unsigned_char,_std::allocator<unsigned_char>_> zdata;
  State state;
  uint local_2a4;
  char local_29d [5];
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_298;
  uint local_26c;
  uchar *local_268;
  iterator iStack_260;
  uchar *local_258;
  vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
  *local_250;
  uchar *local_248;
  uchar *local_240;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *local_238;
  LodePNGState local_230;
  
  State::State((State *)&local_230);
  puVar15 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
            super__Vector_impl_data._M_start;
  uVar8 = lodepng_inspect(&local_2a4,&local_26c,&local_230,puVar15,
                          (long)(png->
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                                _M_impl.super__Vector_impl_data._M_finish - (long)puVar15);
  uVar14 = 1;
  if (uVar8 == 0) {
    local_240 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
                super__Vector_impl_data._M_finish;
    puVar15 = (png->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
              super__Vector_impl_data._M_start + 8;
    local_268 = (uchar *)0x0;
    iStack_260._M_current = (uchar *)0x0;
    local_258 = (uchar *)0x0;
    ppuVar1 = &local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    local_250 = filterTypes;
    local_248 = puVar15;
    local_238 = png;
    do {
      if ((local_240 <= puVar15 + 8) || (puVar15 < local_248)) goto LAB_0011bded;
      lodepng_chunk_type(local_29d,puVar15);
      local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)ppuVar1;
      sVar10 = strlen(local_29d);
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_298,local_29d,local_29d + sVar10);
      puVar5 = local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_finish;
      if ((pointer *)
          local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != ppuVar1) {
        operator_delete(local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (ulong)(local_298.
                                super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
      }
      cVar13 = '\x03';
      if (puVar5 == (pointer)0x4) {
        local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start = (pointer)ppuVar1;
        sVar10 = strlen(local_29d);
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&local_298,local_29d,local_29d + sVar10);
        iVar9 = std::__cxx11::string::compare((char *)&local_298);
        if ((pointer *)
            local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
            super__Vector_impl_data._M_start != ppuVar1) {
          operator_delete(local_298.
                          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                          super__Vector_impl_data._M_start,
                          (ulong)(local_298.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage + 1));
        }
        if (iVar9 == 0) {
          puVar11 = lodepng_chunk_data_const(puVar15);
          uVar8 = lodepng_chunk_length(puVar15);
          uVar17 = (ulong)uVar8;
          cVar13 = '\x01';
          if ((local_240 < puVar15 + uVar17 + 0xc) ||
             (puVar15 + uVar17 + 0xc < local_248 ||
              (ulong)((long)(local_238->
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                            _M_impl.super__Vector_impl_data._M_finish -
                     (long)(local_238->
                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>).
                           _M_impl.super__Vector_impl_data._M_start) < uVar17)) goto LAB_0011bda4;
          if (uVar8 != 0) {
            do {
              if (iStack_260._M_current == local_258) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          ((vector<unsigned_char,std::allocator<unsigned_char>> *)&local_268,
                           iStack_260,puVar11);
              }
              else {
                *iStack_260._M_current = *puVar11;
                iStack_260._M_current = iStack_260._M_current + 1;
              }
              puVar11 = puVar11 + 1;
              uVar17 = uVar17 - 1;
            } while (uVar17 != 0);
          }
        }
        puVar11 = lodepng_chunk_next_const(puVar15);
        bVar4 = puVar11 <= puVar15;
        if (puVar15 < puVar11) {
          puVar15 = puVar11;
        }
        cVar13 = bVar4 * '\x03';
      }
LAB_0011bda4:
    } while (cVar13 == '\0');
    if (cVar13 == '\x03') {
LAB_0011bded:
      local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      uVar8 = decompress(&local_298,local_268,(long)iStack_260._M_current - (long)local_268,
                         &lodepng_default_decompress_settings);
      pvVar7 = local_250;
      uVar14 = 1;
      if (uVar8 == 0) {
        if (local_230.info_png.interlace_method == 0) {
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::resize(local_250,1);
          sVar12 = lodepng_get_raw_size(local_2a4,1,&local_230.info_png.color);
          if (local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_finish !=
              local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
              super__Vector_impl_data._M_start) {
            uVar17 = 0;
            do {
              pvVar3 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                       (pvVar7->
                       super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start;
              iVar2._M_current = *(uchar **)(pvVar3 + 8);
              if (iVar2._M_current == *(uchar **)(pvVar3 + 0x10)) {
                std::vector<unsigned_char,std::allocator<unsigned_char>>::
                _M_realloc_insert<unsigned_char_const&>
                          (pvVar3,iVar2,
                           (uchar *)((long)local_298.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start + uVar17));
              }
              else {
                *iVar2._M_current =
                     *(uchar *)((long)local_298.
                                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                      ._M_impl.super__Vector_impl_data._M_start + uVar17);
                *(long *)(pvVar3 + 8) = *(long *)(pvVar3 + 8) + 1;
              }
              uVar17 = uVar17 + sVar12 + 1;
            } while (uVar17 < (ulong)((long)local_298.
                                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                            ._M_impl.super__Vector_impl_data._M_finish -
                                     (long)local_298.
                                           super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                           ._M_impl.super__Vector_impl_data._M_start));
          }
        }
        else {
          std::
          vector<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
          ::resize(local_250,7);
          lVar16 = 0;
          lVar18 = 0;
          do {
            uVar6 = local_26c;
            uVar8 = getFilterTypesInterlaced::ADAM7_IY[lVar16];
            uVar14 = getFilterTypesInterlaced::ADAM7_DY[lVar16];
            w_00 = (~getFilterTypesInterlaced::ADAM7_IX[lVar16] + local_2a4 +
                   getFilterTypesInterlaced::ADAM7_DX[lVar16]) /
                   getFilterTypesInterlaced::ADAM7_DX[lVar16];
            if (local_2a4 <= getFilterTypesInterlaced::ADAM7_IX[lVar16]) {
              w_00 = 0;
            }
            sVar12 = lodepng_get_raw_size(w_00,1,&local_230.info_png.color);
            pvVar7 = local_250;
            uVar17 = (ulong)(~uVar8 + uVar6 + uVar14) / (ulong)uVar14;
            if (uVar6 <= uVar8) {
              uVar17 = 0;
            }
            if ((int)uVar17 != 0) {
              do {
                pvVar3 = (vector<unsigned_char,std::allocator<unsigned_char>> *)
                         ((pvVar7->
                          super__Vector_base<std::vector<unsigned_char,_std::allocator<unsigned_char>_>,_std::allocator<std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start + lVar16);
                iVar2._M_current = *(uchar **)(pvVar3 + 8);
                if (iVar2._M_current == *(uchar **)(pvVar3 + 0x10)) {
                  std::vector<unsigned_char,std::allocator<unsigned_char>>::
                  _M_realloc_insert<unsigned_char_const&>
                            (pvVar3,iVar2,
                             (uchar *)((long)local_298.
                                             super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                             ._M_impl.super__Vector_impl_data._M_start + lVar18));
                }
                else {
                  *iVar2._M_current =
                       *(uchar *)((long)local_298.
                                        super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                                        ._M_impl.super__Vector_impl_data._M_start + lVar18);
                  *(long *)(pvVar3 + 8) = *(long *)(pvVar3 + 8) + 1;
                }
                lVar18 = lVar18 + sVar12 + 1;
                uVar17 = uVar17 - 1;
              } while (uVar17 != 0);
            }
            lVar16 = lVar16 + 1;
          } while (lVar16 != 7);
        }
        uVar14 = 0;
      }
      if ((pointer *)
          local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (pointer *)0x0) {
        operator_delete(local_298.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                        _M_impl.super__Vector_impl_data._M_start,
                        (long)local_298.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_298.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
    }
    else {
      uVar14 = 1;
    }
    if (local_268 != (uchar *)0x0) {
      operator_delete(local_268,(long)local_258 - (long)local_268);
    }
  }
  State::~State((State *)&local_230);
  return uVar14;
}

Assistant:

unsigned getFilterTypesInterlaced(std::vector<std::vector<unsigned char> >& filterTypes,
                                  const std::vector<unsigned char>& png) {
  //Get color type and interlace type
  lodepng::State state;
  unsigned w, h;
  unsigned error;
  error = lodepng_inspect(&w, &h, &state, &png[0], png.size());

  if(error) return 1;

  //Read literal data from all IDAT chunks
  const unsigned char *chunk, *begin, *end, *next;
  end = &png.back() + 1;
  begin = chunk = &png.front() + 8;

  std::vector<unsigned char> zdata;

  while(chunk + 8 < end && chunk >= begin) {
    char type[5];
    lodepng_chunk_type(type, chunk);
    if(std::string(type).size() != 4) break; //Probably not a PNG file

    if(std::string(type) == "IDAT") {
      const unsigned char* cdata = lodepng_chunk_data_const(chunk);
      unsigned clength = lodepng_chunk_length(chunk);
      if(chunk + clength + 12 > end || clength > png.size() || chunk + clength + 12 < begin) {
        // corrupt chunk length
        return 1;
      }

      for(unsigned i = 0; i < clength; i++) {
        zdata.push_back(cdata[i]);
      }
    }

    next = lodepng_chunk_next_const(chunk);
    if (next <= chunk) break; // integer overflow
    chunk = next;
  }

  //Decompress all IDAT data (if the while loop ended early, this might fail)
  std::vector<unsigned char> data;
  error = lodepng::decompress(data, &zdata[0], zdata.size());

  if(error) return 1;

  if(state.info_png.interlace_method == 0) {
    filterTypes.resize(1);

    //A line is 1 filter byte + all pixels
    size_t linebytes = 1 + lodepng_get_raw_size(w, 1, &state.info_png.color);

    for(size_t i = 0; i < data.size(); i += linebytes) {
      filterTypes[0].push_back(data[i]);
    }
  } else {
    //Interlaced
    filterTypes.resize(7);
    static const unsigned ADAM7_IX[7] = { 0, 4, 0, 2, 0, 1, 0 }; /*x start values*/
    static const unsigned ADAM7_IY[7] = { 0, 0, 4, 0, 2, 0, 1 }; /*y start values*/
    static const unsigned ADAM7_DX[7] = { 8, 8, 4, 4, 2, 2, 1 }; /*x delta values*/
    static const unsigned ADAM7_DY[7] = { 8, 8, 8, 4, 4, 2, 2 }; /*y delta values*/
    size_t pos = 0;
    for(size_t j = 0; j < 7; j++) {
      unsigned w2 = (w - ADAM7_IX[j] + ADAM7_DX[j] - 1) / ADAM7_DX[j];
      unsigned h2 = (h - ADAM7_IY[j] + ADAM7_DY[j] - 1) / ADAM7_DY[j];
      if(ADAM7_IX[j] >= w) w2 = 0;
      if(ADAM7_IY[j] >= h) h2 = 0;
      size_t linebytes = 1 + lodepng_get_raw_size(w2, 1, &state.info_png.color);
      for(size_t i = 0; i < h2; i++) {
        filterTypes[j].push_back(data[pos]);
        pos += linebytes;
      }
    }
  }
  return 0; /* OK */
}